

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void wave_morale_flag(tgestate_t *state)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint8_t *puVar4;
  uint uVar5;
  short sVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  bVar3 = state->game_counter;
  bVar1 = bVar3 + 1;
  state->game_counter = bVar1;
  if ((bVar3 & 1) != 0) {
    bVar3 = state->displayed_morale;
    if (state->morale != bVar3) {
      if (state->morale < bVar3) {
        state->displayed_morale = bVar3 - 1;
        puVar4 = (state->speccy->screen).pixels;
        uVar5 = *(int *)&state->moraleflag_screen_address - (int)puVar4;
        uVar2 = uVar5 + 0x100;
        if ((uVar2 & 0x700) == 0) {
          sVar6 = (short)uVar5 + 0x20;
          if ((~uVar5 & 0xe0) != 0) {
            sVar6 = (short)uVar2 + -0x7e0;
          }
          puVar7 = (uint8_t *)(long)sVar6;
        }
        else {
          puVar7 = (uint8_t *)((ulong)uVar2 & 0xffff);
        }
      }
      else {
        state->displayed_morale = bVar3 + 1;
        puVar7 = state->moraleflag_screen_address;
        puVar8 = (uint8_t *)0x6e0;
        if (((ulong)(puVar7 + (-0x30 - (long)state->speccy)) & 0xe0) == 0) {
          puVar8 = (uint8_t *)0xffffffffffffffe0;
        }
        puVar4 = (uint8_t *)0xffffffffffffff00;
        if (((ulong)(puVar7 + (-0x30 - (long)state->speccy)) & 0x700) == 0) {
          puVar4 = puVar8;
        }
      }
      state->moraleflag_screen_address = puVar4 + (long)puVar7;
    }
    if ((bVar1 & 2) == 0) {
      puVar7 = "";
    }
    else {
      puVar7 = "";
    }
    plot_bitmap(state,puVar7,state->moraleflag_screen_address,'\x03','\x19');
    return;
  }
  return;
}

Assistant:

void wave_morale_flag(tgestate_t *state)
{
  uint8_t       *pgame_counter;     /* was HL */
  uint8_t        morale;            /* was A */
  uint8_t       *pdisplayed_morale; /* was HL */
  uint8_t       *scanline;          /* was HL */
  const uint8_t *flag_bitmap;       /* was DE */

  assert(state != NULL);

  pgame_counter = &state->game_counter;
  (*pgame_counter)++;

  /* Wave the flag on every other turn. */
  if (*pgame_counter & 1)
    return;

  morale = state->morale;
  pdisplayed_morale = &state->displayed_morale;
  if (morale != *pdisplayed_morale)
  {
    if (morale < *pdisplayed_morale)
    {
      /* Decreasing morale. */
      (*pdisplayed_morale)--;
      scanline = get_next_scanline(state, state->moraleflag_screen_address);
    }
    else
    {
      /* Increasing morale. */
      (*pdisplayed_morale)++;
      scanline = get_prev_scanline(state, state->moraleflag_screen_address);
    }
    state->moraleflag_screen_address = scanline;
  }

  flag_bitmap = &flag_down[0];
  if (*pgame_counter & 2)
    flag_bitmap = &flag_up[0];
  plot_bitmap(state,
              flag_bitmap,
              state->moraleflag_screen_address,
              3, 25);
}